

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int element0(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok == 0xf) {
    return 0;
  }
  iVar1 = 0x23;
  pcVar2 = element1;
  if ((tok != 0x12) && (tok != 0x29)) {
    iVar1 = -1;
    pcVar2 = error;
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static
int element0(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = element1;
    return XML_ROLE_ELEMENT_NAME;
  }
  return common(state, tok);
}